

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

void curl_formfree(curl_httppost *form)

{
  curl_httppost *pcVar1;
  ulong uVar2;
  
  if (form != (curl_httppost *)0x0) {
    do {
      pcVar1 = form->next;
      curl_formfree(form->more);
      uVar2 = form->flags;
      if ((uVar2 & 4) == 0) {
        (*Curl_cfree)(form->name);
        uVar2 = form->flags;
      }
      if ((uVar2 & 0x58) == 0) {
        (*Curl_cfree)(form->contents);
      }
      (*Curl_cfree)(form->contenttype);
      (*Curl_cfree)(form->showfilename);
      (*Curl_cfree)(form);
      form = pcVar1;
    } while (pcVar1 != (curl_httppost *)0x0);
  }
  return;
}

Assistant:

void curl_formfree(struct curl_httppost *form)
{
  struct curl_httppost *next;

  if(!form)
    /* no form to free, just get out of this */
    return;

  do {
    next=form->next;  /* the following form line */

    /* recurse to sub-contents */
    curl_formfree(form->more);

    if(!(form->flags & HTTPPOST_PTRNAME))
      free(form->name); /* free the name */
    if(!(form->flags &
         (HTTPPOST_PTRCONTENTS|HTTPPOST_BUFFER|HTTPPOST_CALLBACK))
      )
      free(form->contents); /* free the contents */
    free(form->contenttype); /* free the content type */
    free(form->showfilename); /* free the faked file name */
    free(form);       /* free the struct */

  } while((form = next) != NULL); /* continue */
}